

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecompressHeader3(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int *width,int *height
                       ,int *jpegSubsamp,int *jpegColorspace)

{
  j_decompress_ptr cinfo;
  uint uVar1;
  void *__dest;
  undefined8 *puVar2;
  int iVar3;
  char *pcVar4;
  size_t __n;
  undefined1 auVar5 [16];
  
  if (handle == (tjhandle)0x0) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar2 + 7) = 0x656c646e616820;
    *puVar2 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    pcVar4 = "tjDecompressHeader3(): Instance has not been initialized for decompression";
LAB_00138d7c:
    __n = 0x4b;
LAB_00138d82:
    memcpy((void *)((long)handle + 0x608),pcVar4,__n);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    __dest = (void *)__tls_get_addr(&PTR_0019df20);
    memcpy(__dest,pcVar4,__n);
  }
  else {
    auVar5._0_4_ = -(uint)(jpegBuf == (uchar *)0x0);
    auVar5._4_4_ = -(uint)(width == (int *)0x0);
    auVar5._8_4_ = -(uint)(height == (int *)0x0);
    auVar5._12_4_ = -(uint)(jpegSubsamp == (int *)0x0);
    iVar3 = movmskps((int)jpegSize,auVar5);
    if ((jpegColorspace != (int *)0x0 && jpegSize != 0) && iVar3 == 0) {
      iVar3 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar3 != 0) {
        return -1;
      }
      cinfo = (j_decompress_ptr)((long)handle + 0x208);
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      jpeg_read_header(cinfo,1);
      *width = *(int *)((long)handle + 0x238);
      *height = *(int *)((long)handle + 0x23c);
      iVar3 = getSubsamp(cinfo);
      *jpegSubsamp = iVar3;
      uVar1 = *(int *)((long)handle + 0x244) - 1;
      iVar3 = -1;
      if (uVar1 < 5) {
        iVar3 = *(int *)(&DAT_0017bd48 + (ulong)uVar1 * 4);
      }
      *jpegColorspace = iVar3;
      jpeg_abort_decompress(cinfo);
      if (*jpegSubsamp < 0) {
        pcVar4 = "tjDecompressHeader3(): Could not determine subsampling type for JPEG image";
        goto LAB_00138d7c;
      }
      if (-1 < *jpegColorspace) {
        if ((0 < *width) && (uVar1 = 0, 0 < *height)) goto LAB_00138ec4;
        builtin_strncpy((char *)((long)handle + 0x628),"ata retu",8);
        builtin_strncpy((char *)((long)handle + 0x630),"rned in ",8);
        builtin_strncpy((char *)((long)handle + 0x618),"er3(): I",8);
        builtin_strncpy((char *)((long)handle + 0x620),"nvalid d",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
        builtin_strncpy((char *)((long)handle + 0x610),"ressHead",8);
        *(undefined8 *)((long)handle + 0x637) = 0x72656461656820;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pcVar4 = (char *)__tls_get_addr(&PTR_0019df20);
        builtin_strncpy(pcVar4 + 0x10,"er3(): Invalid data returned in header",0x27);
        goto LAB_00138eb8;
      }
      pcVar4 = "tjDecompressHeader3(): Could not determine colorspace of JPEG image";
      __n = 0x44;
      goto LAB_00138d82;
    }
    builtin_strncpy((char *)((long)handle + 0x618),"er3(): I",8);
    builtin_strncpy((char *)((long)handle + 0x620),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ressHead",8);
    *(undefined8 *)((long)handle + 0x628) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar4 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar4 + 0x10,"er3(): Invalid argument",0x18);
LAB_00138eb8:
    builtin_strncpy(pcVar4,"tjDecompressHead",0x10);
  }
  uVar1 = 0xffffffff;
LAB_00138ec4:
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar1;
}

Assistant:

DLLEXPORT int tjDecompressHeader3(tjhandle handle,
                                  const unsigned char *jpegBuf,
                                  unsigned long jpegSize, int *width,
                                  int *height, int *jpegSubsamp,
                                  int *jpegColorspace)
{
  int retval = 0;

  GET_DINSTANCE(handle);
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressHeader3(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || width == NULL || height == NULL ||
      jpegSubsamp == NULL || jpegColorspace == NULL)
    THROW("tjDecompressHeader3(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);

  *width = dinfo->image_width;
  *height = dinfo->image_height;
  *jpegSubsamp = getSubsamp(dinfo);
  switch (dinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:  *jpegColorspace = TJCS_GRAY;  break;
  case JCS_RGB:        *jpegColorspace = TJCS_RGB;  break;
  case JCS_YCbCr:      *jpegColorspace = TJCS_YCbCr;  break;
  case JCS_CMYK:       *jpegColorspace = TJCS_CMYK;  break;
  case JCS_YCCK:       *jpegColorspace = TJCS_YCCK;  break;
  default:             *jpegColorspace = -1;  break;
  }

  jpeg_abort_decompress(dinfo);

  if (*jpegSubsamp < 0)
    THROW("tjDecompressHeader3(): Could not determine subsampling type for JPEG image");
  if (*jpegColorspace < 0)
    THROW("tjDecompressHeader3(): Could not determine colorspace of JPEG image");
  if (*width < 1 || *height < 1)
    THROW("tjDecompressHeader3(): Invalid data returned in header");

bailout:
  if (this->jerr.warning) retval = -1;
  return retval;
}